

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser_exception.cpp
# Opt level: O0

void __thiscall
argo::json_parser_exception::json_parser_exception
          (json_parser_exception *this,exception_type et,string *s,size_t byte_index)

{
  size_t sVar1;
  char *pcVar2;
  undefined8 uVar3;
  size_t byte_index_local;
  string *s_local;
  exception_type et_local;
  json_parser_exception *this_local;
  
  json_exception::json_exception(&this->super_json_exception,et);
  *(undefined ***)&this->super_json_exception = &PTR__json_parser_exception_00132a50;
  this->m_byte_index = byte_index;
  pcVar2 = get_main_message(this);
  sVar1 = this->m_byte_index;
  uVar3 = std::__cxx11::string::c_str();
  snprintf((this->super_json_exception).m_message,200,
           "parser exception, %s, at or near byte %zu : %s",pcVar2,sVar1,uVar3);
  return;
}

Assistant:

json_parser_exception::json_parser_exception(exception_type et, const string &s, size_t byte_index) noexcept:
                    json_exception(et),
                    m_byte_index(byte_index)
{
    snprintf(m_message, max_message_length, "parser exception, %s, at or near byte %zu : %s", get_main_message(), m_byte_index, s.c_str());
}